

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_channel.cc
# Opt level: O2

void __thiscall
assembler::VirtualChannel::process
          (VirtualChannel *this,
          unique_ptr<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_> *tpdu,
          vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
          *out)

{
  map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *this_00;
  TransportPDU *this_01;
  byte *pbVar1;
  long lVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  size_type sVar6;
  uint *puVar7;
  ostream *poVar8;
  mapped_type *pmVar9;
  iterator iVar10;
  runtime_error *this_02;
  uint b;
  char *pcVar11;
  __single_object this_03;
  SessionPDU *this_04;
  size_type *this_05;
  VirtualChannel *pVVar12;
  _Head_base<0UL,_assembler::SessionPDU_*,_false> *this_06;
  int *in_R9;
  uint uVar13;
  __single_object spdu;
  uint apid;
  string local_88;
  _Base_ptr local_68;
  _Base_ptr local_60;
  _Base_ptr local_58;
  _Head_base<0UL,_assembler::SessionPDU_*,_false> local_50;
  _Head_base<0UL,_assembler::SessionPDU_*,_false> local_48;
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> local_40;
  _Head_base<0UL,_assembler::SessionPDU_*,_false> local_38;
  
  this_01 = (tpdu->_M_t).
            super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
            ._M_t.
            super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
            .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl;
  pbVar1 = *(byte **)&(this_01->header).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  uVar13 = (uint)pbVar1[1] | (*pbVar1 & 7) << 8;
  if (uVar13 == 0x7ff) {
    return;
  }
  local_68 = (_Base_ptr)out;
  bVar4 = TransportPDU::verifyCRC(this_01);
  local_88._M_dataplus._M_p._0_4_ = uVar13;
  if (!bVar4) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"VC ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->id_);
    poVar8 = std::operator<<(poVar8,": CRC failure; dropping TP_PDU (APID ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,")");
    std::endl<char,std::char_traits<char>>(poVar8);
    std::
    _Rb_tree<int,_std::pair<const_int,_int>,_std::_Select1st<std::pair<const_int,_int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
    ::erase(&(this->apidSeq_)._M_t,(key_type *)&local_88);
LAB_0011907e:
    local_88._M_dataplus._M_p._0_4_ = uVar13;
    std::
    _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
    ::erase(&(this->apidSessionPDU_)._M_t,(key_type *)&local_88);
    return;
  }
  lVar2 = *(long *)&(((tpdu->_M_t).
                      super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                      .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl)->header
                    ).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>;
  b = (uint)*(byte *)(lVar2 + 3) | (*(byte *)(lVar2 + 2) & 0x3f) << 8;
  this_00 = &this->apidSeq_;
  local_60 = (_Base_ptr)(ulong)uVar13;
  sVar6 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::count
                    (this_00,(key_type *)&local_88);
  if (sVar6 != 0) {
    local_88._M_dataplus._M_p._0_4_ = uVar13;
    puVar7 = (uint *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                     ::operator[](this_00,(key_type *)&local_88);
    iVar5 = diffWithWrap<16384u>(*puVar7,b);
    if (1 < iVar5) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"VC ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->id_);
      poVar8 = std::operator<<(poVar8,": Detected TP_PDU drop");
      poVar8 = std::operator<<(poVar8," (skipped ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,iVar5 + -1);
      poVar8 = std::operator<<(poVar8," packet(s)");
      poVar8 = std::operator<<(poVar8," on APID ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8,"; prev: ");
      local_88._M_dataplus._M_p._0_4_ = uVar13;
      pmVar9 = std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
               operator[](this_00,(key_type *)&local_88);
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,*pmVar9);
      poVar8 = std::operator<<(poVar8,", packet: ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8,")");
      std::endl<char,std::char_traits<char>>(poVar8);
    }
  }
  local_88._M_dataplus._M_p._0_4_ = uVar13;
  puVar7 = (uint *)std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::
                   operator[](this_00,(key_type *)&local_88);
  *puVar7 = b;
  bVar3 = *(byte *)(*(long *)&(((tpdu->_M_t).
                                super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                                .super__Head_base<0UL,_assembler::TransportPDU_*,_false>.
                               _M_head_impl)->header).
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_> + 2)
          >> 6;
  if ((bVar3 | 2) != 3) {
    if ((bVar3 & 1) != 0) {
      this_02 = (runtime_error *)__cxa_allocate_exception(0x10);
      spdu._M_t.
      super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>._M_t
      .super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl._0_4_ = 0xe1;
      util::str<char[46],char[103],char[2],int>
                (&local_88,(util *)"Assertion `flag == 0 || flag == 2` failed at ",
                 (char (*) [46])
                 "/workspace/llm4binary/github/license_c_cmakelists/pietern[P]goestools/src/assembler/virtual_channel.cc"
                 ,(char (*) [103])0x14014f,(char (*) [2])&spdu,in_R9);
      std::runtime_error::runtime_error(this_02,(string *)&local_88);
      __cxa_throw(this_02,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_88._M_dataplus._M_p._0_4_ = uVar13;
    iVar10 = std::
             _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
             ::find(&(this->apidSessionPDU_)._M_t,(key_type *)&local_88);
    if ((_Rb_tree_header *)iVar10._M_node ==
        &(this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    this_04 = (SessionPDU *)iVar10._M_node[1]._M_parent;
    bVar4 = SessionPDU::append(this_04,(tpdu->_M_t).
                                       super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                                       .super__Head_base<0UL,_assembler::TransportPDU_*,_false>.
                                       _M_head_impl);
    if (bVar4) {
      if (bVar3 != 2) {
        return;
      }
      local_50._M_head_impl = (SessionPDU *)iVar10._M_node[1]._M_parent;
      iVar10._M_node[1]._M_parent = (_Base_ptr)0x0;
      finish((VirtualChannel *)this_04,
             (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
             &local_50,
             (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
              *)local_68);
      this_06 = &local_50;
    }
    else {
      poVar8 = std::operator<<((ostream *)&std::cerr,"VC ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->id_);
      poVar8 = std::operator<<(poVar8,": Unable to append to S_PDU on APID ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::endl<char,std::char_traits<char>>(poVar8);
      bVar4 = SessionPDU::finish((SessionPDU *)iVar10._M_node[1]._M_parent);
      if (!bVar4) goto LAB_0011907e;
      poVar8 = std::operator<<((ostream *)&std::cerr,"VC ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->id_);
      poVar8 = std::operator<<(poVar8,": Finished S_PDU for APID ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," (");
      SessionPDU::getName_abi_cxx11_(&local_88,(SessionPDU *)iVar10._M_node[1]._M_parent);
      poVar8 = std::operator<<(poVar8,(string *)&local_88);
      poVar8 = std::operator<<(poVar8,")");
      std::endl<char,std::char_traits<char>>(poVar8);
      pVVar12 = (VirtualChannel *)&local_88;
      std::__cxx11::string::~string((string *)pVVar12);
      local_48._M_head_impl = (SessionPDU *)iVar10._M_node[1]._M_parent;
      iVar10._M_node[1]._M_parent = (_Base_ptr)0x0;
      finish(pVVar12,(unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                      *)&local_48,
             (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
              *)local_68);
      this_06 = &local_48;
    }
    std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::~unique_ptr
              ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
               this_06);
    goto LAB_0011907e;
  }
  local_58 = (_Base_ptr)&this->apidSessionPDU_;
  local_88._M_dataplus._M_p._0_4_ = uVar13;
  iVar10 = std::
           _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
           ::find((_Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                   *)local_58,(key_type *)&local_88);
  if ((_Rb_tree_header *)iVar10._M_node !=
      &(this->apidSessionPDU_)._M_t._M_impl.super__Rb_tree_header) {
    poVar8 = std::operator<<((ostream *)&std::cerr,"VC ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->id_);
    poVar8 = std::operator<<(poVar8,": New S_PDU for ");
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    poVar8 = std::operator<<(poVar8,", but didn\'t finish previous one");
    std::endl<char,std::char_traits<char>>(poVar8);
    bVar4 = SessionPDU::finish((SessionPDU *)iVar10._M_node[1]._M_parent);
    if (bVar4) {
      poVar8 = std::operator<<((ostream *)&std::cerr,"VC ");
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->id_);
      poVar8 = std::operator<<(poVar8,": Finished S_PDU for APID ");
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      poVar8 = std::operator<<(poVar8," (");
      SessionPDU::getName_abi_cxx11_(&local_88,(SessionPDU *)iVar10._M_node[1]._M_parent);
      poVar8 = std::operator<<(poVar8,(string *)&local_88);
      poVar8 = std::operator<<(poVar8,")");
      std::endl<char,std::char_traits<char>>(poVar8);
      pVVar12 = (VirtualChannel *)&local_88;
      std::__cxx11::string::~string((string *)pVVar12);
      local_38._M_head_impl = (SessionPDU *)iVar10._M_node[1]._M_parent;
      iVar10._M_node[1]._M_parent = (_Base_ptr)0x0;
      finish(pVVar12,(unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                      *)&local_38,
             (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
              *)local_68);
      std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
      ~unique_ptr((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
                  &local_38);
    }
    local_88._M_dataplus._M_p._0_4_ = uVar13;
    std::
    _Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
    ::erase((_Rb_tree<int,_std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>,_std::_Select1st<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
             *)local_58,(key_type *)&local_88);
  }
  std::make_unique<assembler::SessionPDU,int&,unsigned_int&>((int *)&spdu,(uint *)this);
  this_03 = spdu;
  bVar4 = SessionPDU::append((SessionPDU *)
                             spdu._M_t.
                             super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                             .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl,
                             (tpdu->_M_t).
                             super___uniq_ptr_impl<assembler::TransportPDU,_std::default_delete<assembler::TransportPDU>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_assembler::TransportPDU_*,_std::default_delete<assembler::TransportPDU>_>
                             .super__Head_base<0UL,_assembler::TransportPDU_*,_false>._M_head_impl);
  if (bVar4) {
    if (bVar3 == 3) {
      if (*(long *)((long)spdu._M_t.
                          super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                          .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl + 0x10
                   ) ==
          *(long *)((long)spdu._M_t.
                          super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
                          .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl + 8))
      {
        poVar8 = std::operator<<((ostream *)&std::cerr,"VC ");
        poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->id_);
        pcVar11 = ": Zero length S_PDU for APID ";
        goto LAB_0011911e;
      }
      local_40._M_t.
      super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>._M_t
      .super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           spdu._M_t.
           super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
           .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl;
      spdu._M_t.
      super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>._M_t
      .super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           (__uniq_ptr_data<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>,_true,_true>
            )(__uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>)
             0x0;
      finish((VirtualChannel *)
             this_03._M_t.
             super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
             ._M_t.
             super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
             .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl,&local_40,
             (vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
              *)local_68);
      this_05 = (size_type *)&local_40;
    }
    else {
      this_05 = &local_88._M_string_length;
      local_88._M_string_length =
           (size_type)
           spdu._M_t.
           super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
           ._M_t.
           super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>
           .super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl;
      spdu._M_t.
      super___uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>._M_t
      .super__Tuple_impl<0UL,_assembler::SessionPDU_*,_std::default_delete<assembler::SessionPDU>_>.
      super__Head_base<0UL,_assembler::SessionPDU_*,_false>._M_head_impl =
           (__uniq_ptr_data<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>,_true,_true>
            )(__uniq_ptr_impl<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>)
             0x0;
      local_88._M_dataplus._M_p._0_4_ = uVar13;
      std::
      _Rb_tree<int,std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>>
      ::
      _M_emplace_unique<std::pair<unsigned_int,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>
                ((_Rb_tree<int,std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>,std::_Select1st<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>,std::less<int>,std::allocator<std::pair<int_const,std::unique_ptr<assembler::SessionPDU,std::default_delete<assembler::SessionPDU>>>>>
                  *)local_58,
                 (pair<unsigned_int,_std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>
                  *)&local_88);
    }
    std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::~unique_ptr
              ((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
               this_05);
  }
  else {
    poVar8 = std::operator<<((ostream *)&std::cerr,"VC ");
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->id_);
    pcVar11 = ": Invalid first S_PDU for APID ";
LAB_0011911e:
    poVar8 = std::operator<<(poVar8,pcVar11);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::~unique_ptr
            (&spdu);
  return;
}

Assistant:

void VirtualChannel::process(
    std::unique_ptr<TransportPDU> tpdu,
    std::vector<std::unique_ptr<SessionPDU>>& out) {
  auto apid = tpdu->apid();

  // Ignore fill packets
  if (apid == 2047) {
    return;
  }

  // Verify CRC is correct
  if (!tpdu->verifyCRC()) {
    std::cerr
      << "VC "
      << id_
      << ": CRC failure; dropping TP_PDU (APID " << apid << ")"
      << std::endl;

    // Clear state for this APID.
    apidSeq_.erase(apid);
    apidSessionPDU_.erase(apid);
    return;
  }

  // The sequence counter is described as (section 6.2.1):
  //
  // > 14-bit packet sequence count, straight sequential count (modulo
  // > 16384) that numbers each source packet generated per APID.
  //
  // Sanity check on this counter to protect against drops.
  //
  auto seq = tpdu->sequenceCount();
  if (apidSeq_.count(apid) > 0) {
    auto skip = diffWithWrap<16384>(apidSeq_[apid], seq) - 1;
    if (skip > 0) {
      std::cerr
        << "VC "
        << id_
        << ": Detected TP_PDU drop"
        << " (skipped " << skip << " packet(s)"
        << " on APID " << apid
        << "; prev: " << apidSeq_[apid]
        << ", packet: " << seq
        << ")"
        << std::endl;
    }
  }
  apidSeq_[apid] = seq;

  // Sequence Flag:
  // - Set to 3 if the user data contains one user data file entirely;
  // - Set to 1 if the user data contains the first segment of one user
  //   data file extending through subsequent packets;
  // - Set to 0 if the user data contains a continuation segment of one
  //   user data file still extending through subsequent packets;
  // - Set to 2 if the user data contains the last segment of a user data
  //   file beginning in an earlier packet.
  auto flag = tpdu->sequenceFlag();
  if (flag == 3 || flag == 1) {
    auto it = apidSessionPDU_.find(apid);
    if (it != apidSessionPDU_.end()) {
      std::cerr
        << "VC "
        << id_
        << ": New S_PDU for "
        << apid
        << ", but didn't finish previous one"
        << std::endl;

      // Try to finish pending S_PDU
      auto& spdu = it->second;
      if (spdu->finish()) {
        std::cerr
          << "VC "
          << id_
          << ": Finished S_PDU for APID "
          << apid
          << " (" << spdu->getName() << ")"
          << std::endl;
        finish(std::move(spdu), out);
      }

      // Erase pending S_PDU as it won't be finished now
      apidSessionPDU_.erase(apid);
    }

    auto spdu = std::make_unique<SessionPDU>(id_, apid);
    if (!spdu->append(*tpdu)) {
      std::cerr
        << "VC "
        << id_
        << ": Invalid first S_PDU for APID "
        << apid
        << std::endl;
    } else {
      // Check if this S_PDU is contained in a single TP_PDU
      if (flag == 3) {
        if (spdu->size() == 0) {
          std::cerr
            << "VC "
            << id_
            << ": Zero length S_PDU for APID "
            << apid
            << std::endl;
        } else {
          finish(std::move(spdu), out);
        }
      } else {
        // Expecting subsequent TP_PDUs to fill this S_PDU
        apidSessionPDU_.insert(std::make_pair(apid, std::move(spdu)));
      }
    }
  } else {
    ASSERT(flag == 0 || flag == 2);

    auto it = apidSessionPDU_.find(apid);
    if (it == apidSessionPDU_.end()) {
      // This is not a valid continuation
      if (false) {
        std::cerr
          << "VC "
          << id_
          << ": Expected to have part of S_PDU for APID "
          << apid
          << std::endl;
      }
    } else {
      // Append data from TP_PDU to S_PDU
      auto& spdu = it->second;
      if (!spdu->append(*tpdu)) {
        std::cerr
          << "VC "
          << id_
          << ": Unable to append to S_PDU on APID "
          << apid
          << std::endl;

        // Unable to append; perhaps this continuation belongs
        // to the next S_PDU on this APID and everything in between
        // was dropped. Try to finish at least the previous S_PDU.
        if (spdu->finish()) {
          std::cerr
            << "VC "
            << id_
            << ": Finished S_PDU for APID "
            << apid
            << " (" << spdu->getName() << ")"
            << std::endl;
          finish(std::move(spdu), out);
        }

        // Erase S_PDU regardless if it was finished or not
        apidSessionPDU_.erase(apid);
      } else {
        // Successfully appended TP_PDU to S_PDU
        if (flag == 2) {
          finish(std::move(spdu), out);
          apidSessionPDU_.erase(apid);
        }
      }
    }
  }
}